

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O1

void __thiscall AgenPeeps::PeepFunc(AgenPeeps *this)

{
  IRKind IVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *pFVar9;
  undefined4 *puVar10;
  Instr *blockStart;
  Instr *instr2;
  Instr *this_00;
  
  bVar4 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
  if (bVar4) {
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,AtomPhase,uVar5,uVar6);
    if (bVar4) {
      return;
    }
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,AgenPeepsPhase,uVar5,uVar6);
    if (bVar4) {
      return;
    }
  }
  else {
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,AtomPhase,uVar5,uVar6);
    if (!bVar4) {
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
      pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,AgenPeepsPhase,uVar5,uVar6);
      if (!bVar4) {
        return;
      }
    }
  }
  this_00 = this->func->m_headInstr;
  if (this_00 != (Instr *)0x0) {
    iVar7 = 0;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    blockStart = (Instr *)0x0;
    do {
      pIVar2 = this_00->m_next;
      bVar4 = IR::Instr::IsRealInstr(this_00);
      if (((bVar4) || (this_00->m_kind == InstrKindProfiledLabel)) ||
         (this_00->m_kind == InstrKindLabel)) {
        IVar1 = this_00->m_kind;
        if ((((IVar1 == InstrKindBranch) || (IVar1 == InstrKindExit)) ||
            ((this_00->m_opcode - 0x23 < 3 || (this_00->m_opcode - 0x173 < 2)))) ||
           ((IVar1 < 7 && ((0x68U >> (IVar1 & 0x1f) & 1) != 0)))) {
          blockStart = IR::Instr::GetNextRealInstr(this_00);
          iVar7 = 0;
          pIVar2 = blockStart;
        }
        else {
          instr2 = IR::Instr::GetNextRealInstrOrLabel(this_00);
          IVar1 = instr2->m_kind;
          if ((((IVar1 == InstrKindBranch) || (IVar1 == InstrKindExit)) ||
              (instr2->m_opcode - 0x23 < 3)) || (instr2->m_opcode - 0x173 < 2)) {
LAB_00654fc6:
            iVar7 = 0;
          }
          else if ((IVar1 < 7) && ((0x68U >> (IVar1 & 0x1f) & 1) != 0)) {
            iVar7 = 0;
          }
          else {
            bVar4 = AgenDependentInstrs(this,this_00,instr2);
            if (!bVar4) goto LAB_00654fc6;
            if (blockStart == (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/AgenPeeps.cpp"
                                 ,0x3e,"(blockStart)","blockStart");
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar10 = 0;
            }
            iVar7 = MoveInstrUp(this,this_00,blockStart,iVar7);
            iVar7 = iVar7 + -3;
          }
        }
      }
      this_00 = pIVar2;
    } while (this_00 != (Instr *)0x0);
  }
  return;
}

Assistant:

void AgenPeeps::PeepFunc()
{
    int distance = 0;
    IR::Instr *blockStart, *nextRealInstr;
    const uint stall_cycles = 3;

    if (AutoSystemInfo::Data.IsAtomPlatform())
    {
        // On Atom, always optimize unless phase is off
        if (PHASE_OFF(Js::AtomPhase, func) || PHASE_OFF(Js::AgenPeepsPhase, func))
            return;
    }
    else
    {
        // On other platforms, don't optimize unless phase is forced
        if (!PHASE_FORCE(Js::AtomPhase, func) && !PHASE_FORCE(Js::AgenPeepsPhase, func))
            return;
    }

    blockStart = nullptr;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        if (!instr->IsRealInstr() && !instr->IsLabelInstr())
            continue;

        // BB boundary ?
        if (instr->EndsBasicBlock() || instr->StartsBasicBlock())
        {
            distance = 0;
            instrNext = blockStart = instr->GetNextRealInstr();
            continue;
        }
        nextRealInstr = instr->GetNextRealInstrOrLabel();
        // Check for AGEN dependency with the next instruction in the same BB
        if (!nextRealInstr->EndsBasicBlock() && !nextRealInstr->StartsBasicBlock() &&
            AgenDependentInstrs(instr, nextRealInstr))
        {
            Assert(blockStart);
            // Move instr up
            distance = MoveInstrUp(instr, blockStart, distance) - stall_cycles;
        } else
            distance = 0;

    } NEXT_INSTR_IN_FUNC_EDITING;
}